

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O3

void __thiscall
test::string_assertion_test::iu_StrCaseTest_x_iutest_x_CaseEqString_Test<char>::Body
          (iu_StrCaseTest_x_iutest_x_CaseEqString_Test<char> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char **in_R9;
  AssertionResult iutest_ar;
  String Test;
  String test;
  allocator<char> local_231;
  AssertionResult local_230;
  AssertionHelper local_208;
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8 [2];
  long local_1a8 [2];
  undefined1 local_198 [392];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,(char *)text<char>::test,(allocator<char> *)local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1d8,text<char>::Test,(allocator<char> *)local_198);
  local_198._0_8_ = local_1d8[0];
  local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)text<char>::test
  ;
  iutest::internal::StrCaseEqHelper::Assertion<char_const*,char_const*>
            (&local_230,(StrCaseEqHelper *)0x338c68,"TestFixture::Text::test",local_198,
             (char **)&local_208,in_R9);
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xd7;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  paVar1 = &local_230.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  local_198._0_8_ = local_1d8[0];
  local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_1b8[0];
  iutest::internal::StrCaseEqHelper::Assertion<char_const*,char_const*>
            (&local_230,(StrCaseEqHelper *)0x338c68,"test",local_198,(char **)&local_208,in_R9);
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xd8;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  local_198._0_8_ = text<char>::test;
  local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_1d8[0];
  iutest::internal::StrCaseEqHelper::Assertion<char_const*,char_const*>
            (&local_230,(StrCaseEqHelper *)"TestFixture::Text::test","Test",local_198,
             (char **)&local_208,in_R9);
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xd9;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  local_198._0_8_ = local_1d8[0];
  local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)text<char>::test
  ;
  iutest::internal::StrCaseEqHelper::Assertion<char_const*,char_const*>
            (&local_230,(StrCaseEqHelper *)0x338c68,"TestFixture::Text::test",local_198,
             (char **)&local_208,in_R9);
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xdb;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  local_198._0_8_ = local_1d8[0];
  local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_1b8[0];
  iutest::internal::StrCaseEqHelper::Assertion<char_const*,char_const*>
            (&local_230,(StrCaseEqHelper *)0x338c68,"test",local_198,(char **)&local_208,in_R9);
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xdc;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  local_198._0_8_ = text<char>::test;
  local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_1d8[0];
  iutest::internal::StrCaseEqHelper::Assertion<char_const*,char_const*>
            (&local_230,(StrCaseEqHelper *)"TestFixture::Text::test","Test",local_198,
             (char **)&local_208,in_R9);
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xdd;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  local_198._0_8_ = local_1d8[0];
  local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)text<char>::test
  ;
  iutest::internal::StrCaseEqHelper::Assertion<char_const*,char_const*>
            (&local_230,(StrCaseEqHelper *)0x338c68,"TestFixture::Text::test",local_198,
             (char **)&local_208,in_R9);
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xdf;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_230.m_message._M_dataplus._M_p,
                      local_230.m_message.field_2._M_allocated_capacity + 1);
    }
    local_198._0_8_ = local_1d8[0];
    local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_1b8[0];
    iutest::internal::StrCaseEqHelper::Assertion<char_const*,char_const*>
              (&local_230,(StrCaseEqHelper *)0x338c68,"test",local_198,(char **)&local_208,in_R9);
    if (local_230.m_result == false) {
      memset((iu_global_format_stringstream *)local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_198);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
      local_208.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
      ;
      local_208.m_part_result.super_iuCodeMessage.m_line = 0xe0;
      local_208.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_230.m_message._M_dataplus._M_p,
                        local_230.m_message.field_2._M_allocated_capacity + 1);
      }
      local_198._0_8_ = text<char>::test;
      local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_1d8[0]
      ;
      iutest::internal::StrCaseEqHelper::Assertion<char_const*,char_const*>
                (&local_230,(StrCaseEqHelper *)"TestFixture::Text::test","Test",local_198,
                 (char **)&local_208,in_R9);
      if (local_230.m_result != false) goto LAB_002e21f5;
      memset((iu_global_format_stringstream *)local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_198);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
      local_208.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
      ;
      local_208.m_part_result.super_iuCodeMessage.m_line = 0xe1;
      local_208.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
      &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
    operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
LAB_002e21f5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrCaseTest, CaseEqString)
{
    typename TestFixture::String test = TestFixture::Text::test;
    typename TestFixture::String Test = TestFixture::Text::Test;
    IUTEST_INFORM_STRCASEEQ(Test, TestFixture::Text::test);
    IUTEST_INFORM_STRCASEEQ(Test, test);
    IUTEST_INFORM_STRCASEEQ(TestFixture::Text::test, Test);

    IUTEST_EXPECT_STRCASEEQ(Test, TestFixture::Text::test);
    IUTEST_EXPECT_STRCASEEQ(Test, test);
    IUTEST_EXPECT_STRCASEEQ(TestFixture::Text::test, Test);

    IUTEST_ASSERT_STRCASEEQ(Test, TestFixture::Text::test);
    IUTEST_ASSERT_STRCASEEQ(Test, test);
    IUTEST_ASSERT_STRCASEEQ(TestFixture::Text::test, Test);
}